

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP.h
# Opt level: O0

void __thiscall
ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor(TimedTextDescriptor *this)

{
  allocator<char> local_11;
  TimedTextDescriptor *local_10;
  TimedTextDescriptor *this_local;
  
  local_10 = this;
  Rational::Rational(&this->EditRate);
  this->ContainerDuration = 0;
  std::__cxx11::string::string((string *)&this->NamespaceName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->EncodingName,"UTF-8",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::__cxx11::
  list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
  ::list(&this->ResourceList);
  std::__cxx11::string::string((string *)&this->RFC5646LanguageTagList);
  memset(this->AssetID,0,0x10);
  return;
}

Assistant:

TimedTextDescriptor() : ContainerDuration(0), EncodingName("UTF-8") { memset(AssetID, 0, UUIDlen); }